

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canceled.c
# Opt level: O0

rxc_sink_logic * create_logic(rxc_sink *self)

{
  rxc_sink_logic *logic;
  rxc_sink *self_local;
  
  self_local = (rxc_sink *)malloc(0x38);
  if (self_local == (rxc_sink *)0x0) {
    self_local = (rxc_sink *)0x0;
  }
  else {
    self_local->dealloc = (_func_void_rxc_sink_ptr_int *)self;
    self_local[1].dealloc = free;
    self_local[1].create_logic = on_connect;
    self_local[2].dealloc = on_push;
    self_local[2].create_logic = on_upstream_finish;
    self_local[3].dealloc = on_upstream_failure;
  }
  return (rxc_sink_logic *)self_local;
}

Assistant:

static struct rxc_sink_logic *  create_logic(struct rxc_sink *self)
{
    struct rxc_sink_logic *logic = malloc(sizeof(struct rxc_sink_logic));

    if (!logic) {
        return NULL;
    }

    logic->sink = self;
    logic->dealloc = (void (*)(struct rxc_sink_logic *)) free;
    logic->on_connect = on_connect;
    logic->on_push = on_push;
    logic->on_upstream_finish = on_upstream_finish;
    logic->on_upstream_failure = on_upstream_failure;

    return logic;
}